

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.h
# Opt level: O0

void __thiscall HighsSparseMatrix::HighsSparseMatrix(HighsSparseMatrix *this)

{
  long in_RDI;
  HighsSparseMatrix *this_00;
  
  this_00 = (HighsSparseMatrix *)(in_RDI + 0x10);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49b511);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49b524);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49b537);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b54a);
  clear(this_00);
  return;
}

Assistant:

HighsSparseMatrix() { clear(); }